

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  uint_least8_t *puVar1;
  error_handler eVar2;
  type tVar3;
  basic_format_specs<wchar_t> *pbVar4;
  uint uVar5;
  error_handler *peVar6;
  wchar_t wVar7;
  error_handler *this;
  error_handler *local_20;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_18;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == L'}') {
    return begin;
  }
  local_20 = (error_handler *)begin;
  local_20 = (error_handler *)
             parse_align<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                       (begin,end,handler);
  if (local_20 == (error_handler *)end) {
    return (wchar_t *)local_20;
  }
  eVar2 = *local_20;
  if (eVar2 == (error_handler)0x20) {
    tVar3 = handler->arg_type_;
    if (tVar3 == named_arg_type) goto LAB_00204c63;
    if (8 < tVar3 - named_arg_type) goto LAB_00204c82;
    if ((tVar3 - named_arg_type < 7) &&
       ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
LAB_00204c9a:
      error_handler::on_error((error_handler *)begin,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00204afc:
    local_20 = local_20 + 4;
  }
  else {
    if (eVar2 == (error_handler)0x2d) {
      tVar3 = handler->arg_type_;
      if (tVar3 == named_arg_type) goto LAB_00204c63;
      if (8 < tVar3 - named_arg_type) goto LAB_00204c82;
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) goto LAB_00204c9a;
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00204afc;
    }
    if (eVar2 == (error_handler)0x2b) {
      tVar3 = handler->arg_type_;
      if (tVar3 == named_arg_type) goto LAB_00204c63;
      if (8 < tVar3 - named_arg_type) goto LAB_00204c82;
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) goto LAB_00204c9a;
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00204afc;
    }
  }
  if (local_20 != (error_handler *)end) {
    if (*(wchar_t *)local_20 == L'#') {
      if (handler->arg_type_ == named_arg_type) goto LAB_00204c63;
      if (8 < handler->arg_type_ - named_arg_type) goto LAB_00204c82;
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 8;
      local_20 = local_20 + 4;
      if (local_20 == (error_handler *)end) {
        return (wchar_t *)local_20;
      }
    }
    if (*(wchar_t *)local_20 == L'0') {
      if (handler->arg_type_ == named_arg_type) {
LAB_00204c63:
        __assert_fail("(t != internal::named_arg_type) && \"invalid argument type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/core.h"
                      ,0x222,"bool fmt::internal::is_arithmetic(type)");
      }
      if (8 < handler->arg_type_ - named_arg_type) {
LAB_00204c82:
        error_handler::on_error((error_handler *)begin,"format specifier requires numeric argument")
        ;
      }
      pbVar4 = (handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               ).super_specs_setter<wchar_t>.specs_;
      (pbVar4->super_align_spec).fill_ = L'0';
      (pbVar4->super_align_spec).align_ = ALIGN_NUMERIC;
      local_20 = local_20 + 4;
      if (local_20 == (error_handler *)end) {
        return (wchar_t *)local_20;
      }
    }
    this = local_20;
    local_20 = (error_handler *)
               parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                         ((wchar_t *)local_20,end,handler);
    if (local_20 != (error_handler *)end) {
      if (*(wchar_t *)local_20 == L'.') {
        peVar6 = local_20 + 4;
        if (peVar6 == (error_handler *)end) {
          wVar7 = L'\0';
        }
        else {
          wVar7 = *(wchar_t *)peVar6;
        }
        if ((uint)(wVar7 + L'\xffffffd0') < 10) {
          local_20 = peVar6;
          uVar5 = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                            ((wchar_t **)&local_20,end,handler);
          (((handler->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
            ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).precision = uVar5;
        }
        else {
          if (wVar7 != L'{') {
            local_20 = peVar6;
            error_handler::on_error(this,"missing precision specifier");
          }
          peVar6 = local_20 + 8;
          local_20 = peVar6;
          if (peVar6 != (error_handler *)end) {
            local_18.handler = handler;
            local_20 = (error_handler *)
                       parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                                 ((wchar_t *)peVar6,end,&local_18);
            this = peVar6;
          }
          if ((local_20 == (error_handler *)end) ||
             (peVar6 = local_20 + 4, wVar7 = *(wchar_t *)local_20, local_20 = peVar6, wVar7 != L'}')
             ) {
            error_handler::on_error(this,"invalid format string");
          }
        }
        specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
        ::end_precision(handler);
      }
      if ((local_20 != (error_handler *)end) && (wVar7 = *(wchar_t *)local_20, wVar7 != L'}')) {
        local_20 = local_20 + 4;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).type = (char)wVar7;
      }
    }
  }
  return (wchar_t *)local_20;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}